

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowdiscrepancy.cpp
# Opt level: O0

string * pbrt::ToString_abi_cxx11_(RandomizeStrategy r)

{
  undefined4 in_ESI;
  string *in_RDI;
  undefined4 in_stack_00000048;
  int in_stack_00000054;
  char *in_stack_00000058;
  LogLevel in_stack_00000064;
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  switch(in_ESI) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8,
               in_stack_ffffffffffffffe0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffff3);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8,
               in_stack_ffffffffffffffe0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe3);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8,
               in_stack_ffffffffffffffe0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe2);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8,
               in_stack_ffffffffffffffe0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe1);
    break;
  default:
    LogFatal(in_stack_00000064,in_stack_00000058,in_stack_00000054,
             (char *)CONCAT44(r,in_stack_00000048));
  }
  return in_RDI;
}

Assistant:

std::string ToString(RandomizeStrategy r) {
    switch (r) {
    case RandomizeStrategy::None:
        return "None";
    case RandomizeStrategy::CranleyPatterson:
        return "CranleyPatterson";
    case RandomizeStrategy::Xor:
        return "Xor";
    case RandomizeStrategy::Owen:
        return "Owen";
    default:
        LOG_FATAL("Unhandled RandomizeStrategy");
        return "";
    }
}